

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t zeGetKernelProcAddrTable(ze_api_version_t version,ze_kernel_dditable_t *pDdiTable)

{
  ze_result_t result;
  ze_kernel_dditable_t *pDdiTable_local;
  ze_api_version_t version_local;
  
  if (pDdiTable == (ze_kernel_dditable_t *)0x0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (driver::context < (int)version) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
  }
  else {
    pDdiTable->pfnCreate = driver::zeKernelCreate;
    pDdiTable->pfnDestroy = driver::zeKernelDestroy;
    pDdiTable->pfnSetCacheConfig = driver::zeKernelSetCacheConfig;
    pDdiTable->pfnSetGroupSize = driver::zeKernelSetGroupSize;
    pDdiTable->pfnSuggestGroupSize = driver::zeKernelSuggestGroupSize;
    pDdiTable->pfnSuggestMaxCooperativeGroupCount = driver::zeKernelSuggestMaxCooperativeGroupCount;
    pDdiTable->pfnSetArgumentValue = driver::zeKernelSetArgumentValue;
    pDdiTable->pfnSetIndirectAccess = driver::zeKernelSetIndirectAccess;
    pDdiTable->pfnGetIndirectAccess = driver::zeKernelGetIndirectAccess;
    pDdiTable->pfnGetSourceAttributes = driver::zeKernelGetSourceAttributes;
    pDdiTable->pfnGetProperties = driver::zeKernelGetProperties;
    pDdiTable->pfnGetName = driver::zeKernelGetName;
    pDdiTable_local._4_4_ = ZE_RESULT_SUCCESS;
  }
  return pDdiTable_local._4_4_;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetKernelProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_kernel_dditable_t* pDdiTable                 ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( driver::context.version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    pDdiTable->pfnCreate                                 = driver::zeKernelCreate;

    pDdiTable->pfnDestroy                                = driver::zeKernelDestroy;

    pDdiTable->pfnSetCacheConfig                         = driver::zeKernelSetCacheConfig;

    pDdiTable->pfnSetGroupSize                           = driver::zeKernelSetGroupSize;

    pDdiTable->pfnSuggestGroupSize                       = driver::zeKernelSuggestGroupSize;

    pDdiTable->pfnSuggestMaxCooperativeGroupCount        = driver::zeKernelSuggestMaxCooperativeGroupCount;

    pDdiTable->pfnSetArgumentValue                       = driver::zeKernelSetArgumentValue;

    pDdiTable->pfnSetIndirectAccess                      = driver::zeKernelSetIndirectAccess;

    pDdiTable->pfnGetIndirectAccess                      = driver::zeKernelGetIndirectAccess;

    pDdiTable->pfnGetSourceAttributes                    = driver::zeKernelGetSourceAttributes;

    pDdiTable->pfnGetProperties                          = driver::zeKernelGetProperties;

    pDdiTable->pfnGetName                                = driver::zeKernelGetName;

    return result;
}